

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

int __thiscall QAbstractScrollAreaPrivate::init(QAbstractScrollAreaPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QAbstractScrollArea *pQVar2;
  QAbstractScrollAreaPrivate *this_00;
  QAbstractScrollAreaScrollBarContainer *this_01;
  QAbstractScrollAreaScrollBarContainer **ppQVar3;
  QAbstractScrollAreaScrollBarContainer *pQVar4;
  long in_FS_OFFSET;
  QAbstractScrollArea *q;
  QAbstractScrollArea *pQVar5;
  QWidget *in_stack_fffffffffffffe98;
  QWidget *this_02;
  QWidget *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int max;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffeac;
  int min;
  QWidget *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  Orientation orientation;
  QAbstractScrollAreaScrollBarContainer *in_stack_fffffffffffffee0;
  QAbstractScrollAreaScrollBarContainer *this_03;
  char *this_04;
  QObject local_60 [8];
  QObject local_58 [24];
  QObject local_40 [8];
  QObject local_38 [44];
  undefined4 local_c;
  long local_8;
  
  orientation = (Orientation)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(this);
  this_00 = (QAbstractScrollAreaPrivate *)operator_new(0x28);
  local_c = 0;
  pQVar5 = pQVar2;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x4957b4);
  QWidget::QWidget(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (WindowFlags)in_stack_fffffffffffffeac.i);
  this->viewport = (QWidget *)this_00;
  this_02 = this->viewport;
  Qt::Literals::StringLiterals::operator____L1((char *)this_02,(size_t)this_00);
  str.m_data._0_4_ = in_stack_fffffffffffffea8;
  str.m_size = (qsizetype)in_stack_fffffffffffffea0;
  str.m_data._4_4_ = in_stack_fffffffffffffeac.i;
  QAnyStringView::QAnyStringView((QAnyStringView *)this_02,str);
  QObject::setObjectName((QAnyStringView *)this_02);
  QWidget::setBackgroundRole((QWidget *)this_00,(ColorRole)((ulong)pQVar5 >> 0x20));
  QWidget::setAutoFillBackground(in_stack_fffffffffffffea0,SUB81((ulong)this_02 >> 0x38,0));
  this_01 = (QAbstractScrollAreaScrollBarContainer *)operator_new(0x40);
  QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
            (in_stack_fffffffffffffee0,orientation,in_stack_fffffffffffffed0);
  this_03 = (QAbstractScrollAreaScrollBarContainer *)&this->scrollBarContainers;
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  *ppQVar3 = this_01;
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  max = (int)*ppQVar3;
  min = (int)((ulong)*ppQVar3 >> 0x20);
  Qt::Literals::StringLiterals::operator____L1((char *)this_02,(size_t)this_00);
  str_00.m_data._0_4_ = max;
  str_00.m_size = (qsizetype)this_01;
  str_00.m_data._4_4_ = min;
  QAnyStringView::QAnyStringView((QAnyStringView *)this_02,str_00);
  QObject::setObjectName((QAnyStringView *)CONCAT44(min,max));
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  this->hbar = (*ppQVar3)->scrollBar;
  QAbstractSlider::setRange((QAbstractSlider *)this_01,min,max);
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  (**(code **)(*(long *)&(*ppQVar3)->super_QWidget + 0x68))(*ppQVar3,0);
  QObject::installEventFilter((QObject *)this->hbar);
  this_04 = "2valueChanged(int)";
  QObject::connect(local_38,(char *)this->hbar,(QObject *)"2valueChanged(int)",(char *)pQVar2,
                   0xab27e3);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,(char *)this->hbar,(QObject *)"2rangeChanged(int,int)",(char *)pQVar2,
                   0xab281a);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar4 = (QAbstractScrollAreaScrollBarContainer *)operator_new(0x40);
  QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
            (this_03,orientation,(QWidget *)pQVar4);
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  *ppQVar3 = pQVar4;
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  pQVar4 = *ppQVar3;
  Qt::Literals::StringLiterals::operator____L1((char *)this_02,(size_t)this_00);
  str_01.m_data._0_4_ = max;
  str_01.m_size = (qsizetype)this_01;
  str_01.m_data._4_4_ = min;
  QAnyStringView::QAnyStringView((QAnyStringView *)this_02,str_01);
  QObject::setObjectName((QAnyStringView *)pQVar4);
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  this->vbar = (*ppQVar3)->scrollBar;
  QAbstractSlider::setRange((QAbstractSlider *)this_01,min,max);
  ppQVar3 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)this_00,
                       (Orientation)((ulong)pQVar5 >> 0x20));
  (**(code **)(*(long *)&(*ppQVar3)->super_QWidget + 0x68))(*ppQVar3,0);
  QObject::installEventFilter((QObject *)this->vbar);
  QObject::connect(local_58,(char *)this->vbar,(QObject *)this_04,(char *)pQVar2,0xab27f3);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)this->vbar,(QObject *)"2rangeChanged(int,int)",(char *)pQVar2,
                   0xab281a);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  operator_new(0x18);
  QAbstractScrollAreaFilter::QAbstractScrollAreaFilter((QAbstractScrollAreaFilter *)this_02,this_00)
  ;
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::reset
            ((QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_> *)this_00,
             &this_02->super_QObject);
  pQVar1 = this->viewport;
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::data(&this->viewportFilter);
  QObject::installEventFilter(&pQVar1->super_QObject);
  QWidget::setFocusProxy((QWidget *)this_04,&this_03->super_QWidget);
  QWidget::setFocusPolicy((QWidget *)this_00,(FocusPolicy)((ulong)pQVar5 >> 0x20));
  ::operator|((Shape)((ulong)this_00 >> 0x20),(Shadow)this_00);
  QFrame::setFrameStyle((QFrame *)this_01,(int)((ulong)this_02 >> 0x20));
  QWidget::setSizePolicy((QWidget *)this_00,(Policy)((ulong)pQVar5 >> 0x20),(Policy)pQVar5);
  layoutChildren(this_00);
  QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0x495d44);
  QWidget::grabGesture
            ((QWidget *)this_00,(GestureType)this_02,
             (QFlagsStorageHelper<Qt::GestureFlag,_4>)SUB84((ulong)this_02 >> 0x20,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::init()
{
    Q_Q(QAbstractScrollArea);
    viewport = new QWidget(q);
    viewport->setObjectName("qt_scrollarea_viewport"_L1);
    viewport->setBackgroundRole(QPalette::Base);
    viewport->setAutoFillBackground(true);
    scrollBarContainers[Qt::Horizontal] = new QAbstractScrollAreaScrollBarContainer(Qt::Horizontal, q);
    scrollBarContainers[Qt::Horizontal]->setObjectName("qt_scrollarea_hcontainer"_L1);
    hbar = scrollBarContainers[Qt::Horizontal]->scrollBar;
    hbar->setRange(0,0);
    scrollBarContainers[Qt::Horizontal]->setVisible(false);
    hbar->installEventFilter(q);
    QObject::connect(hbar, SIGNAL(valueChanged(int)), q, SLOT(_q_hslide(int)));
    QObject::connect(hbar, SIGNAL(rangeChanged(int,int)), q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
    scrollBarContainers[Qt::Vertical] = new QAbstractScrollAreaScrollBarContainer(Qt::Vertical, q);
    scrollBarContainers[Qt::Vertical]->setObjectName("qt_scrollarea_vcontainer"_L1);
    vbar = scrollBarContainers[Qt::Vertical]->scrollBar;
    vbar->setRange(0,0);
    scrollBarContainers[Qt::Vertical]->setVisible(false);
    vbar->installEventFilter(q);
    QObject::connect(vbar, SIGNAL(valueChanged(int)), q, SLOT(_q_vslide(int)));
    QObject::connect(vbar, SIGNAL(rangeChanged(int,int)), q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
    viewportFilter.reset(new QAbstractScrollAreaFilter(this));
    viewport->installEventFilter(viewportFilter.data());
    viewport->setFocusProxy(q);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setFrameStyle(QFrame::StyledPanel | QFrame::Sunken);
    q->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
    layoutChildren();
#ifndef Q_OS_MACOS
#  ifndef QT_NO_GESTURES
    viewport->grabGesture(Qt::PanGesture);
#  endif
#endif
}